

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writekey.cpp
# Opt level: O1

int writekey_main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  long *plVar3;
  mcberepair *this;
  long *plVar4;
  string *out;
  basic_istream<char,_std::char_traits<char>_> *in;
  uint uVar5;
  string_view key_00;
  Status status;
  string path;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  DB db;
  Status local_990;
  long *local_988;
  long local_980;
  long local_978;
  long lStack_970;
  char *local_968;
  size_type sStack_960;
  char local_958;
  undefined7 uStack_957;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  string local_928;
  undefined4 local_908;
  undefined4 uStack_904;
  undefined4 uStack_900;
  undefined4 uStack_8fc;
  DB local_8f8;
  
  if ((argc < 4) || (iVar2 = strcmp("help",argv[1]), iVar2 == 0)) {
    printf("Usage: %s writekey <minecraft_world_dir> <key> < input.bin\n",*argv);
    return 1;
  }
  mcberepair::slurp_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_948,(mcberepair *)&std::cin,in);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f8,argv[2],(allocator<char> *)&local_968);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_8f8);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_978 = *plVar4;
    lStack_970 = plVar3[3];
    local_988 = &local_978;
  }
  else {
    local_978 = *plVar4;
    local_988 = (long *)*plVar3;
  }
  local_980 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_8f8.options_.comparator != (Comparator *)&local_8f8.options_.env) {
    operator_delete(local_8f8.options_.comparator,
                    (ulong)((long)&(local_8f8.options_.env)->_vptr_Env + 1));
  }
  out = (string *)0x0;
  mcberepair::DB::DB(&local_8f8,(char *)local_988,false,false);
  if ((_Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>)
      local_8f8.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
      super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
      super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl == (DB *)0x0) {
    writekey_main();
    uVar5 = 1;
  }
  else {
    sStack_960 = 0;
    local_958 = '\0';
    __s = argv[3];
    local_968 = &local_958;
    this = (mcberepair *)strlen(__s);
    key_00._M_str = (char *)&local_968;
    key_00._M_len = (size_t)__s;
    bVar1 = mcberepair::decode_key(this,key_00,out);
    if (bVar1) {
      local_928._M_dataplus._M_p = local_968;
      local_928._M_string_length = sStack_960;
      local_908 = local_948._M_dataplus._M_p._0_4_;
      uStack_904 = local_948._M_dataplus._M_p._4_4_;
      uStack_900 = (undefined4)local_948._M_string_length;
      uStack_8fc = local_948._M_string_length._4_4_;
      (*(*(_func_int ***)
          local_8f8.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>.
          _M_t.super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
          super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl)[2])(&local_990);
      bVar1 = local_990.state_ != (char *)0x0;
      if (bVar1) {
        leveldb::Status::ToString_abi_cxx11_(&local_928,&local_990);
        writekey_main();
      }
      uVar5 = (uint)bVar1;
      if (local_990.state_ != (char *)0x0) {
        operator_delete__(local_990.state_);
      }
    }
    else {
      writekey_main();
      uVar5 = 1;
    }
    if (local_968 != &local_958) {
      operator_delete(local_968,CONCAT71(uStack_957,local_958) + 1);
    }
  }
  if ((_Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>)
      local_8f8.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
      super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
      super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl != (DB *)0x0) {
    (*(*(_func_int ***)
        local_8f8.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>.
        _M_t.super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
        super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl)[1])();
  }
  local_8f8.db_._M_t.super___uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>._M_t.
  super__Tuple_impl<0UL,_leveldb::DB_*,_std::default_delete<leveldb::DB>_>.
  super__Head_base<0UL,_leveldb::DB_*,_false>._M_head_impl =
       (__uniq_ptr_data<leveldb::DB,_std::default_delete<leveldb::DB>,_true,_true>)
       (__uniq_ptr_impl<leveldb::DB,_std::default_delete<leveldb::DB>_>)0x0;
  leveldb::Logger::~Logger(&local_8f8.info_log.super_Logger);
  if (local_8f8.block_cache_._M_t.
      super___uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>._M_t.
      super__Tuple_impl<0UL,_leveldb::Cache_*,_std::default_delete<leveldb::Cache>_>.
      super__Head_base<0UL,_leveldb::Cache_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>)0x0) {
    (**(code **)(*(long *)local_8f8.block_cache_._M_t.
                          super___uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_leveldb::Cache_*,_std::default_delete<leveldb::Cache>_>
                          .super__Head_base<0UL,_leveldb::Cache_*,_false>._M_head_impl + 8))();
  }
  local_8f8.block_cache_._M_t.
  super___uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>._M_t.
  super__Tuple_impl<0UL,_leveldb::Cache_*,_std::default_delete<leveldb::Cache>_>.
  super__Head_base<0UL,_leveldb::Cache_*,_false>._M_head_impl =
       (__uniq_ptr_data<leveldb::Cache,_std::default_delete<leveldb::Cache>,_true,_true>)
       (__uniq_ptr_impl<leveldb::Cache,_std::default_delete<leveldb::Cache>_>)0x0;
  if (local_8f8.filter_policy_._M_t.
      super___uniq_ptr_impl<const_leveldb::FilterPolicy,_std::default_delete<const_leveldb::FilterPolicy>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_leveldb::FilterPolicy_*,_std::default_delete<const_leveldb::FilterPolicy>_>
      .super__Head_base<0UL,_const_leveldb::FilterPolicy_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<const_leveldb::FilterPolicy,_std::default_delete<const_leveldb::FilterPolicy>_>
       )0x0) {
    (*(*(_func_int ***)
        local_8f8.filter_policy_._M_t.
        super___uniq_ptr_impl<const_leveldb::FilterPolicy,_std::default_delete<const_leveldb::FilterPolicy>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_leveldb::FilterPolicy_*,_std::default_delete<const_leveldb::FilterPolicy>_>
        .super__Head_base<0UL,_const_leveldb::FilterPolicy_*,_false>._M_head_impl)[1])();
  }
  if (local_988 != &local_978) {
    operator_delete(local_988,local_978 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_948._M_dataplus._M_p._4_4_,local_948._M_dataplus._M_p._0_4_) ==
      &local_948.field_2) {
    return uVar5;
  }
  operator_delete((undefined1 *)
                  CONCAT44(local_948._M_dataplus._M_p._4_4_,local_948._M_dataplus._M_p._0_4_),
                  local_948.field_2._M_allocated_capacity + 1);
  return uVar5;
}

Assistant:

int writekey_main(int argc, char* argv[]) {
    if(argc < 4 || strcmp("help", argv[1]) == 0) {
        printf("Usage: %s writekey <minecraft_world_dir> <key> < input.bin\n",
               argv[0]);
        return EXIT_FAILURE;
    }

#ifdef _WIN32
    _setmode(_fileno(stdin), O_BINARY);
#endif

    // slurp from stdin into value before we open db
    auto value = mcberepair::slurp_string(std::cin);

    // construct path for Minecraft BE database
    std::string path = std::string(argv[2]) + "/db";

    // open the database
    mcberepair::DB db{path.c_str()};

    if(!db) {
        fprintf(stderr, "ERROR: Opening '%s' failed.\n", path.c_str());
        return EXIT_FAILURE;
    }

    std::string key;
    if(!mcberepair::decode_key(argv[3], &key)) {
        fprintf(stderr, "ERROR: key '%s' is malformed\n", argv[3]);
        return EXIT_FAILURE;
    }

    leveldb::Status status = db().Put({}, key, value);

    if(!status.ok()) {
        // LCOV_EXCL_START
        fprintf(stderr, "ERROR: Reading key '%s' failed: %s\n", argv[3],
                status.ToString().c_str());
        return EXIT_FAILURE;
        // LCOV_EXCL_STOP
    }

    return EXIT_SUCCESS;
}